

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O3

error<idx2::err_code> __thiscall idx2::StrToMetaData(idx2 *this,stref FilePath,metadata *Meta)

{
  bool bVar1;
  dtype dVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  long lVar8;
  long *in_FS_OFFSET;
  stref sVar9;
  error<idx2::err_code> eVar10;
  char DType [8];
  stref FilePath_local;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  lVar5 = FilePath._8_8_;
  FilePath_local.Size = FilePath.field_0._0_4_;
  FilePath_local.field_0 = (anon_union_8_2_2df48d06_for_stref_0)this;
  sVar9 = GetFileName(&FilePath_local);
  iVar3 = __isoc99_sscanf(sVar9.field_0.Ptr,"%[^-]-%[^-]-[%d-%d-%d]-%[^.]",lVar5,lVar5 + 0x40,
                          lVar5 + 0x80,lVar5 + 0x84,lVar5 + 0x88,DType);
  if (iVar3 == 6) {
    iVar3 = tolower((int)DType[0]);
    DType[0] = (char)iVar3;
    sVar4 = strlen(DType);
    local_38 = (undefined4)sVar4;
    lVar8 = 0;
    local_40.Ptr = DType;
    do {
      bVar1 = operator==((stref *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar8),
                         (stref *)&local_40);
      if (bVar1) {
        dVar2 = (&dtype_s::NameMap.Arr[0].ItemVal)[lVar8];
        goto LAB_0019c2fe;
      }
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0xf0);
    dVar2 = __Invalid__;
LAB_0019c2fe:
    *(dtype *)(lVar5 + 0x8c) = dVar2;
    uVar7 = 0x41;
    uVar6 = 0;
  }
  else {
    uVar6 = 0x11;
    uVar7 = 0x3c;
  }
  *(char **)(*in_FS_OFFSET + -0x780) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x880) = uVar7;
  eVar10.Code = (int)uVar6;
  eVar10.StackIdx = (char)((ulong)uVar6 >> 0x20);
  eVar10.StrGened = (bool)(char)((ulong)uVar6 >> 0x28);
  eVar10._14_2_ = (short)((ulong)uVar6 >> 0x30);
  eVar10.Msg = "";
  return eVar10;
}

Assistant:

error<>
StrToMetaData(stref FilePath, metadata* Meta)
{
  stref FileName = GetFileName(FilePath);
  char DType[8];
  idx2_ReturnErrorIf(6 != sscanf(FileName.ConstPtr,
                                 "%[^-]-%[^-]-[%d-%d-%d]-%[^.]",
                                 Meta->Name,
                                 Meta->Field,
                                 &Meta->Dims3.X,
                                 &Meta->Dims3.Y,
                                 &Meta->Dims3.Z,
                                 DType),
                     err_code::ParseFailed);

  DType[0] = (char)tolower(DType[0]);
  Meta->DType = StringTo<dtype>()(stref(DType));

  return idx2_Error(err_code::NoError);
}